

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O3

bool __thiscall Game::IsLineOwned(Game *this,Line line)

{
  Player PVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  do {
    if (8 < *(ulong *)((long)line._M_elems + lVar2)) {
      __assert_fail("index < 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AntoineJT[P]cpp-things/tictactoe.cpp"
                    ,0x3f,"bool Game::IsLineOwned(Line) const");
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  PVar1 = (this->m_board)._M_elems[line._M_elems[1]];
  if ((PVar1 == None) || (PVar1 != (this->m_board)._M_elems[line._M_elems[0]])) {
    bVar3 = false;
  }
  else {
    bVar3 = PVar1 == (this->m_board)._M_elems[line._M_elems[2]];
  }
  return bVar3;
}

Assistant:

bool IsLineOwned(Line line) const noexcept {
            #ifndef NDEBUG
            for (auto index : line) {
                assert(index < 9);
            }
            #endif

            const auto middleCellOwner = m_board[line[1]];
            if (middleCellOwner == Player::None) {
                return false;
            }

            return middleCellOwner == m_board[line[0]]
                && middleCellOwner == m_board[line[2]];
        }